

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_config.c
# Opt level: O2

int main(void)

{
  int iVar1;
  size_t sVar2;
  yajl_val n;
  yajl_val pyVar3;
  char *pcVar4;
  size_t sStack_440;
  char *path [3];
  char errbuf [1024];
  
  errbuf[0] = '\0';
  fileData[0] = '\0';
  sVar2 = fread(fileData,1,0xffff,_stdin);
  if (sVar2 == 0) {
    iVar1 = feof(_stdin);
    if (iVar1 == 0) {
      pcVar4 = "error encountered on file read\n";
      sStack_440 = 0x1f;
      goto LAB_001023c6;
    }
  }
  else if (0xfffe < sVar2) {
    pcVar4 = "config file too big\n";
    sStack_440 = 0x14;
LAB_001023c6:
    fwrite(pcVar4,sStack_440,1,_stderr);
    return 1;
  }
  n = yajl_tree_parse((char *)fileData,errbuf,0x400);
  if (n == (yajl_val)0x0) {
    fwrite("parse_error: ",0xd,1,_stderr);
    if (errbuf[0] == '\0') {
      fwrite("unknown error",0xd,1,_stderr);
    }
    else {
      fprintf(_stderr," %s",errbuf);
    }
    fputc(10,_stderr);
    return 1;
  }
  path[2] = (char *)0x0;
  path[0] = "Logging";
  path[1] = "timeFormat";
  pyVar3 = yajl_tree_get(n,path,yajl_t_string);
  if (pyVar3 == (yajl_val)0x0) {
    printf("no such node: %s/%s\n",path[0],path[1]);
  }
  else {
    if (pyVar3->type == yajl_t_string) {
      pcVar4 = (pyVar3->u).string;
    }
    else {
      pcVar4 = (char *)0x0;
    }
    printf("%s/%s: %s\n",path[0],path[1],pcVar4);
  }
  yajl_tree_free(n);
  return 0;
}

Assistant:

int
main(void)
{
    size_t rd;
    yajl_val node;
    char errbuf[1024];

    /* null plug buffers */
    fileData[0] = errbuf[0] = 0;

    /* read the entire config file */
    rd = fread((void *) fileData, 1, sizeof(fileData) - 1, stdin);

    /* file read error handling */
    if (rd == 0 && !feof(stdin)) {
        fprintf(stderr, "error encountered on file read\n");
        return 1;
    } else if (rd >= sizeof(fileData) - 1) {
        fprintf(stderr, "config file too big\n");
        return 1;
    }

    /* we have the whole config file in memory.  let's parse it ... */
    node = yajl_tree_parse((const char *) fileData, errbuf, sizeof(errbuf));

    /* parse error handling */
    if (node == NULL) {
        fprintf(stderr, "parse_error: ");
        if (strlen(errbuf)) fprintf(stderr, " %s", errbuf);
        else fprintf(stderr, "unknown error");
        fprintf(stderr, "\n");
        return 1;
    }

    /* ... and extract a nested value from the config file */
    {
        const char * path[] = { "Logging", "timeFormat", (const char *) 0 };
        yajl_val v = yajl_tree_get(node, path, yajl_t_string);
        if (v) printf("%s/%s: %s\n", path[0], path[1], YAJL_GET_STRING(v));
        else   printf("no such node: %s/%s\n", path[0], path[1]);
    }

    yajl_tree_free(node);

    return 0;
}